

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O1

InplaceStr GetTypeNameInScope(ExpressionContext *ctx,ScopeData *scope,InplaceStr str)

{
  NamespaceData *pNVar1;
  bool bVar2;
  ScopeData **ppSVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *pcVar6;
  ScopeData *pSVar7;
  ulong uVar8;
  ScopeData *curr;
  int iVar9;
  char *pcVar10;
  uint strLength;
  ulong uVar11;
  InplaceStr IVar12;
  char *__s;
  
  pcVar10 = str.end;
  pcVar6 = str.begin;
  uVar11 = (long)pcVar10 - (long)pcVar6;
  bVar2 = false;
  uVar8 = uVar11 & 0xffffffff;
  pSVar7 = scope;
  iVar9 = (int)uVar11;
  if (scope != (ScopeData *)0x0) {
    do {
      iVar9 = (int)uVar8;
      if (((pSVar7->ownerType != (TypeBase *)0x0) || (pSVar7->ownerFunction != (FunctionData *)0x0))
         && (!bVar2)) break;
      pNVar1 = pSVar7->ownerNamespace;
      if (pNVar1 != (NamespaceData *)0x0) {
        uVar8 = (ulong)(iVar9 + (*(int *)&(pNVar1->name).name.end -
                                *(int *)&(pNVar1->name).name.begin) + 1);
        bVar2 = true;
      }
      iVar9 = (int)uVar8;
      ppSVar3 = &pSVar7->scope;
      pSVar7 = *ppSVar3;
    } while (*ppSVar3 != (ScopeData *)0x0);
  }
  __s = pcVar6;
  if (bVar2) {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(iVar9 + 1));
    __s = (char *)CONCAT44(extraout_var,iVar4);
    pcVar10 = __s + ((ulong)(iVar9 + 1) - 1);
    *pcVar10 = '\0';
    if ((int)uVar11 != 0) {
      pcVar10 = pcVar10 + -(uVar11 & 0xffffffff);
      memcpy(pcVar10,pcVar6,uVar11 & 0xffffffff);
    }
    for (; scope != (ScopeData *)0x0; scope = scope->scope) {
      pNVar1 = scope->ownerNamespace;
      if (pNVar1 != (NamespaceData *)0x0) {
        pcVar6 = (pNVar1->name).name.begin;
        iVar9 = *(int *)&(pNVar1->name).name.end;
        pcVar10[-1] = '.';
        uVar8 = (ulong)(uint)(iVar9 - (int)pcVar6);
        pcVar10 = pcVar10 + (-1 - uVar8);
        memcpy(pcVar10,pcVar6,uVar8);
      }
    }
    if (pcVar10 != __s) {
      __assert_fail("pos == name",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                    ,0x23c,
                    "InplaceStr GetTypeNameInScope(ExpressionContext &, ScopeData *, InplaceStr)");
    }
    sVar5 = strlen(__s);
    pcVar10 = __s + sVar5;
  }
  IVar12.end = pcVar10;
  IVar12.begin = __s;
  return IVar12;
}

Assistant:

InplaceStr GetTypeNameInScope(ExpressionContext &ctx, ScopeData *scope, InplaceStr str)
{
	bool foundNamespace = false;

	unsigned nameLength = str.length();

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if((curr->ownerType || curr->ownerFunction) && !foundNamespace)
			break;

		if(curr->ownerNamespace)
		{
			nameLength += curr->ownerNamespace->name.name.length() + 1;

			foundNamespace = true;
		}
	}

	nameLength += 1;

	if(!foundNamespace)
		return str;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	// Format a string back-to-front
	char *pos = name + nameLength;

	pos -= 1;
	*pos = 0;

	if(unsigned strLength = str.length())
	{
		pos -= strLength;
		memcpy(pos, str.begin, strLength);
	}

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if(curr->ownerNamespace)
		{
			InplaceStr nsName = curr->ownerNamespace->name.name;

			pos -= 1;
			*pos = '.';

			pos -= nsName.length();
			memcpy(pos, nsName.begin, nsName.length());
		}
	}

	assert(pos == name);

	return InplaceStr(name);
}